

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O1

bool __thiscall
World::collidesWithQuads(World *this,vector<Quad_*,_std::allocator<Quad_*>_> *quads,Vec2d *offset)

{
  Quad *this_00;
  int iVar1;
  Vec2d **ppVVar2;
  Vec2d *this_01;
  ostream *poVar3;
  pointer ppQVar4;
  long lVar5;
  bool bVar6;
  float fVar7;
  string local_70;
  pointer local_50;
  World *local_48;
  Vec2d *local_40;
  float local_38;
  byte local_31;
  
  ppQVar4 = (quads->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_50 = (quads->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  bVar6 = ppQVar4 == local_50;
  local_48 = this;
  local_40 = offset;
  while (local_31 = !bVar6, !bVar6) {
    this_00 = *ppQVar4;
    iVar1 = Quad::getVertexCount(this_00);
    bVar6 = 0 < iVar1;
    if (0 < iVar1) {
      ppVVar2 = Quad::getVertices(this_00);
      this_01 = Vec2d::getOffset(*ppVVar2,local_40);
      fVar7 = Vec2d::getY(this_01);
      if (0.0 <= fVar7) {
        lVar5 = 1;
        do {
          local_38 = Vec2d::getY(this_01);
          fVar7 = Vec2d::getY(local_48->bounds);
          if ((fVar7 < local_38) || (fVar7 = Vec2d::getX(this_01), fVar7 < 0.0)) break;
          local_38 = Vec2d::getX(this_01);
          fVar7 = Vec2d::getX(local_48->bounds);
          if (fVar7 < local_38) break;
          operator_delete(this_01);
          iVar1 = Quad::getVertexCount(this_00);
          bVar6 = lVar5 < iVar1;
          if (iVar1 <= lVar5) goto LAB_0011b864;
          ppVVar2 = Quad::getVertices(this_00);
          this_01 = Vec2d::getOffset(ppVVar2[lVar5],local_40);
          fVar7 = Vec2d::getY(this_01);
          lVar5 = lVar5 + 1;
        } while (0.0 <= fVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Collision with world ",0x15);
      Vec2d::toString_abi_cxx11_(&local_70,this_01);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      operator_delete(this_01);
      if (bVar6) break;
    }
LAB_0011b864:
    ppQVar4 = ppQVar4 + 1;
    bVar6 = ppQVar4 == local_50;
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool World::collidesWithQuads(vector<Quad*>* quads, Vec2d* offset) {
    for (auto quad : *quads) {
        for (int i = 0; i < quad->getVertexCount(); i++) {
            Vec2d* vertex = quad->getVertices()[i]->getOffset(offset);
            if (vertex->getY() < 0 || vertex->getY() > bounds->getY() || vertex->getX() < 0 || vertex->getX() > bounds->getX()) {
                cout << "Collision with world " << vertex->toString() << endl;
                delete vertex;
                return true;
            }
            delete vertex;
        }
    }
    return false;
}